

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O0

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  undefined8 uVar1;
  sunrealtype t_00;
  N_Vector y_00;
  undefined8 in_RDI;
  double dVar2;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  sunrealtype ONE;
  sunrealtype err;
  N_Vector abstol;
  N_Vector ewt;
  N_Vector ytrue;
  int passfail;
  N_Vector in_stack_ffffffffffffffb0;
  uint local_4;
  
  uVar1 = N_VClone(in_RDI);
  t_00 = (sunrealtype)N_VClone(in_RDI);
  y_00 = (N_Vector)N_VClone(in_RDI);
  analytical_solution(t_00,y_00,in_stack_ffffffffffffffb0);
  N_VConst(in_XMM2_Qa,y_00);
  N_VAbs(uVar1,t_00);
  N_VLinearSum(in_XMM1_Qa,0x4024000000000000,t_00,y_00,t_00);
  dVar2 = (double)N_VMin(t_00);
  if (0.0 < dVar2) {
    N_VInv(t_00,t_00);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDI,uVar1,uVar1);
    dVar2 = (double)N_VWrmsNorm(uVar1,t_00);
    local_4 = (uint)(1.0 <= dVar2);
    if (local_4 != 0) {
      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar2);
    }
    N_VDestroy(uVar1);
    N_VDestroy(y_00);
    N_VDestroy(t_00);
  }
  else {
    fprintf(_stderr,"\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0; /* answer pass (0) or fail (1) retval */
  N_Vector ytrue;   /* true solution vector               */
  N_Vector ewt;     /* error weight vector                */
  N_Vector abstol;  /* absolute tolerance vector          */
  sunrealtype err;  /* wrms error                         */
  sunrealtype ONE = SUN_RCONST(1.0);

  /* create solution and error weight vectors */
  ytrue  = N_VClone(y);
  ewt    = N_VClone(y);
  abstol = N_VClone(y);

  /* set the solution data */
  analytical_solution(t, ytrue, abstol);

  /* compute the error weight vector, loosen atol */
  N_VConst(atol, abstol);
  N_VAbs(ytrue, ewt);
  N_VLinearSum(rtol, ewt, SUN_RCONST(10.0), abstol, ewt);
  if (N_VMin(ewt) <= SUN_RCONST(0.0))
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    return (-1);
  }
  N_VInv(ewt, ewt);

  /* compute the solution error */
  N_VLinearSum(ONE, y, -ONE, ytrue, ytrue);
  err = N_VWrmsNorm(ytrue, ewt);

  /* is the solution within the tolerances? */
  passfail = (err < ONE) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  /* Free vectors */
  N_VDestroy(ytrue);
  N_VDestroy(abstol);
  N_VDestroy(ewt);

  return (passfail);
}